

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall cs::token_signal::dump(token_signal *this,ostream *o)

{
  ostream *in_RSI;
  long in_RDI;
  
  std::operator<<(in_RSI,"< Signal = \"");
  switch(*(undefined4 *)(in_RDI + 0x10)) {
  case 0:
    std::operator<<(in_RSI,"[endline]");
    break;
  case 1:
    std::operator<<(in_RSI,"+");
    break;
  case 2:
    std::operator<<(in_RSI,"+=");
    break;
  case 3:
    std::operator<<(in_RSI,"-");
    break;
  case 4:
    std::operator<<(in_RSI,"-=");
    break;
  case 5:
    std::operator<<(in_RSI,"*");
    break;
  case 6:
    std::operator<<(in_RSI,"*=");
    break;
  case 7:
    std::operator<<(in_RSI,"/");
    break;
  case 8:
    std::operator<<(in_RSI,"/=");
    break;
  case 9:
    std::operator<<(in_RSI,"%");
    break;
  case 10:
    std::operator<<(in_RSI,"%=");
    break;
  case 0xb:
    std::operator<<(in_RSI,"^");
    break;
  case 0xc:
    std::operator<<(in_RSI,"^=");
    break;
  case 0xd:
    std::operator<<(in_RSI,",");
    break;
  case 0xe:
    std::operator<<(in_RSI,".");
    break;
  case 0xf:
    std::operator<<(in_RSI,"<");
    break;
  case 0x10:
    std::operator<<(in_RSI,">");
    break;
  case 0x11:
    std::operator<<(in_RSI,"=");
    break;
  case 0x12:
    std::operator<<(in_RSI,":=");
    break;
  case 0x13:
    std::operator<<(in_RSI,"==");
    break;
  case 0x14:
    std::operator<<(in_RSI,"<=");
    break;
  case 0x15:
    std::operator<<(in_RSI,">=");
    break;
  case 0x16:
    std::operator<<(in_RSI,"!=");
    break;
  case 0x17:
    std::operator<<(in_RSI,"&&");
    break;
  case 0x18:
    std::operator<<(in_RSI,"||");
    break;
  case 0x19:
    std::operator<<(in_RSI,"!");
    break;
  case 0x1a:
    std::operator<<(in_RSI,"++");
    break;
  case 0x1b:
    std::operator<<(in_RSI,"--");
    break;
  case 0x1c:
    std::operator<<(in_RSI,":");
    break;
  case 0x1d:
    std::operator<<(in_RSI,"?");
    break;
  case 0x1e:
    std::operator<<(in_RSI,"(");
    break;
  case 0x1f:
    std::operator<<(in_RSI,")");
    break;
  case 0x20:
    std::operator<<(in_RSI,"[");
    break;
  case 0x21:
    std::operator<<(in_RSI,"]");
    break;
  case 0x22:
    std::operator<<(in_RSI,"{");
    break;
  case 0x23:
    std::operator<<(in_RSI,"}");
    break;
  case 0x24:
    std::operator<<(in_RSI,"()");
    break;
  case 0x25:
    std::operator<<(in_RSI,"[]");
    break;
  case 0x26:
    std::operator<<(in_RSI,"{}");
    break;
  case 0x27:
    std::operator<<(in_RSI,"[call]");
    break;
  case 0x28:
    std::operator<<(in_RSI,"[access]");
    break;
  case 0x29:
    std::operator<<(in_RSI,"typeid");
    break;
  case 0x2a:
    std::operator<<(in_RSI,"&");
    break;
  case 0x2b:
    std::operator<<(in_RSI,"new");
    break;
  case 0x2c:
    std::operator<<(in_RSI,"gcnew");
    break;
  case 0x2d:
    std::operator<<(in_RSI,"->");
    break;
  case 0x2e:
    std::operator<<(in_RSI,"[lambda]");
    break;
  case 0x2f:
    std::operator<<(in_RSI,"*");
    break;
  case 0x30:
    std::operator<<(in_RSI,"-");
    break;
  case 0x31:
    std::operator<<(in_RSI,"[vardef]");
    break;
  case 0x32:
    std::operator<<(in_RSI,"[varchk]");
    break;
  case 0x33:
    std::operator<<(in_RSI,"[varprt]");
    break;
  case 0x34:
    std::operator<<(in_RSI,"[vargs]");
    break;
  case 0x35:
    std::operator<<(in_RSI,"=");
    break;
  case 0x36:
    std::operator<<(in_RSI,"[error]");
  }
  std::operator<<(in_RSI,"\" >");
  return false;
}

Assistant:

bool token_signal::dump(std::ostream &o) const
	{
		o << "< Signal = \"";
		switch (mType) {
		case signal_types::add_:
			o << "+";
			break;
		case signal_types::addasi_:
			o << "+=";
			break;
		case signal_types::sub_:
			o << "-";
			break;
		case signal_types::subasi_:
			o << "-=";
			break;
		case signal_types::mul_:
			o << "*";
			break;
		case signal_types::mulasi_:
			o << "*=";
			break;
		case signal_types::div_:
			o << "/";
			break;
		case signal_types::divasi_:
			o << "/=";
			break;
		case signal_types::mod_:
			o << "%";
			break;
		case signal_types::modasi_:
			o << "%=";
			break;
		case signal_types::pow_:
			o << "^";
			break;
		case signal_types::powasi_:
			o << "^=";
			break;
		case signal_types::com_:
			o << ",";
			break;
		case signal_types::dot_:
			o << ".";
			break;
		case signal_types::und_:
			o << "<";
			break;
		case signal_types::abo_:
			o << ">";
			break;
		case signal_types::asi_:
			o << "=";
			break;
		case signal_types::lnkasi_:
			o << ":=";
			break;
		case signal_types::equ_:
			o << "==";
			break;
		case signal_types::ueq_:
			o << "<=";
			break;
		case signal_types::aeq_:
			o << ">=";
			break;
		case signal_types::neq_:
			o << "!=";
			break;
		case signal_types::and_:
			o << "&&";
			break;
		case signal_types::or_:
			o << "||";
			break;
		case signal_types::not_:
			o << "!";
			break;
		case signal_types::inc_:
			o << "++";
			break;
		case signal_types::dec_:
			o << "--";
			break;
		case signal_types::pair_:
			o << ":";
			break;
		case signal_types::choice_:
			o << "?";
			break;
		case signal_types::slb_:
			o << "(";
			break;
		case signal_types::srb_:
			o << ")";
			break;
		case signal_types::mlb_:
			o << "[";
			break;
		case signal_types::mrb_:
			o << "]";
			break;
		case signal_types::llb_:
			o << "{";
			break;
		case signal_types::lrb_:
			o << "}";
			break;
		case signal_types::esb_:
			o << "()";
			break;
		case signal_types::emb_:
			o << "[]";
			break;
		case signal_types::elb_:
			o << "{}";
			break;
		case signal_types::fcall_:
			o << "[call]";
			break;
		case signal_types::access_:
			o << "[access]";
			break;
		case signal_types::typeid_:
			o << "typeid";
			break;
		case signal_types::addr_:
			o << "&";
			break;
		case signal_types::new_:
			o << "new";
			break;
		case signal_types::gcnew_:
			o << "gcnew";
			break;
		case signal_types::arrow_:
			o << "->";
			break;
		case signal_types::lambda_:
			o << "[lambda]";
			break;
		case signal_types::escape_:
			o << "*";
			break;
		case signal_types::minus_:
			o << "-";
			break;
		case signal_types::vardef_:
			o << "[vardef]";
			break;
		case signal_types::varchk_:
			o << "[varchk]";
			break;
		case signal_types::varprt_:
			o << "[varprt]";
			break;
		case signal_types::vargs_:
			o << "[vargs]";
			break;
		case signal_types::bind_:
			o << "=";
			break;
		case signal_types::error_:
			o << "[error]";
			break;
		case signal_types::endline_:
			o << "[endline]";
			break;
		}
		o << "\" >";
		return false;
	}